

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void __thiscall RPCResult::CheckInnerDoc(RPCResult *this)

{
  Type TVar1;
  long in_FS_OFFSET;
  bool bVar2;
  bool local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TVar1 = this->m_type;
  if (TVar1 != OBJ) {
    bVar2 = true;
    if ((TVar1 != ARR) && (TVar1 != ARR_FIXED)) {
      bVar2 = TVar1 == OBJ_DYN;
    }
    local_9 = bVar2 != ((this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                        _M_impl.super__Vector_impl_data._M_start ==
                       (this->m_inner).super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
    inline_check_non_fatal<bool>
              (&local_9,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
               ,0x4bc,"CheckInnerDoc","inner_needed != m_inner.empty()");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RPCResult::CheckInnerDoc() const
{
    if (m_type == Type::OBJ) {
        // May or may not be empty
        return;
    }
    // Everything else must either be empty or not
    const bool inner_needed{m_type == Type::ARR || m_type == Type::ARR_FIXED || m_type == Type::OBJ_DYN};
    CHECK_NONFATAL(inner_needed != m_inner.empty());
}